

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<unsigned_char> *variable,uint8_t *data)

{
  BPInfo *in_RDX;
  SkeletonWriter *in_RSI;
  Variable<unsigned_char> *in_RDI;
  size_t in_stack_00000168;
  size_t in_stack_00000170;
  uint8_t *in_stack_00000178;
  Variable<unsigned_char> *in_stack_00000180;
  
  CurrentStep((SkeletonWriter *)in_RDX);
  Variable<unsigned_char>::SetBlockInfo
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  PutSyncCommon<unsigned_char>(in_RSI,in_RDI,in_RDX);
  std::
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  ::clear((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
           *)0xaa6048);
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}